

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::RepeatedField
          (RepeatedField<unsigned_int> *this,RepeatedField<unsigned_int> *other)

{
  uint *puVar1;
  RepeatedField<unsigned_int> *in_RSI;
  uint *in_RDI;
  int in_stack_0000005c;
  RepeatedField<unsigned_int> *in_stack_00000060;
  int in_stack_0000008c;
  RepeatedField<unsigned_int> *in_stack_00000090;
  int in_stack_000000ec;
  RepeatedField<unsigned_int> *in_stack_000000f0;
  int array_size;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  if (in_RSI->current_size_ != 0) {
    size(in_RSI);
    Reserve(in_stack_000000f0,in_stack_000000ec);
    size(in_RSI);
    AddNAlreadyReserved(in_stack_00000060,in_stack_0000005c);
    puVar1 = Mutable(in_stack_00000090,in_stack_0000008c);
    array_size = (int)((ulong)puVar1 >> 0x20);
    puVar1 = Get(in_stack_00000090,in_stack_0000008c);
    size(in_RSI);
    CopyArray(in_RSI,in_RDI,puVar1,array_size);
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(const RepeatedField& other)
    : current_size_(0), total_size_(0), arena_or_elements_(nullptr) {
  if (other.current_size_ != 0) {
    Reserve(other.size());
    AddNAlreadyReserved(other.size());
    CopyArray(Mutable(0), &other.Get(0), other.size());
  }
}